

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::HierarchyInstantiationSyntax::setChild
          (HierarchyInstantiationSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_015b8f58 + *(int *)(&DAT_015b8f58 + in_RSI * 4)))();
  return;
}

Assistant:

void HierarchyInstantiationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: type = child.token(); return;
        case 2: parameters = child.node() ? &child.node()->as<ParameterValueAssignmentSyntax>() : nullptr; return;
        case 3: instances = child.node()->as<SeparatedSyntaxList<HierarchicalInstanceSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}